

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case2102(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_52c;
  allocator<char> local_52b;
  allocator<char> local_52a;
  allocator<char> local_529;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8 [32];
  Expectation local_4a8;
  Expectation local_3f0;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c8,"struct { int * x ; y * z ; } ;",&local_529);
  Expectation::Expectation(&local_4a8);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"x",&local_52a);
  pDVar1 = Decl::Member(&local_1a8,&local_4e8,FieldDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar2 = Expectation::declaration(&local_4a8,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"z",&local_52b);
  pDVar1 = Decl::Member(&local_338,&local_508,FieldDeclaration);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"y",&local_52c);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_528,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_270);
  Expectation::Expectation(&local_3f0,pEVar2);
  bind(this,(int)local_4c8,(sockaddr *)&local_3f0,__len);
  Expectation::~Expectation(&local_3f0);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_4e8);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_4a8);
  std::__cxx11::string::~string(local_4c8);
  return;
}

Assistant:

void DeclarationBinderTester::case2102()
{
    bind("struct { int * x ; y * z ; } ;",
         Expectation()
             .declaration(Decl().Member("x", SymbolKind::FieldDeclaration)
                      .ty_.Basic(BasicTypeKind::Int_S)
                      .ty_.Derived(TypeKind::Pointer))
             .declaration(Decl().Member("z", SymbolKind::FieldDeclaration)
                      .ty_.Typedef("y")
                      .ty_.Derived(TypeKind::Pointer)));
}